

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmGen12TextureCalc::ScaleTextureHeight
          (GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t Height)

{
  undefined1 local_30 [8];
  CCS_UNIT ScaleFactor;
  
  if ((~(ulong)(pTexInfo->Flags).Gpu & 0x20000000002) == 0) {
    (*(this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
      super_GmmTextureCalc._vptr_GmmTextureCalc[0x29])(this,pTexInfo,local_30);
    Height = Height / ScaleFactor.Align.Depth;
  }
  return Height;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmGen12TextureCalc::ScaleTextureHeight(GMM_TEXTURE_INFO *pTexInfo, uint32_t Height)
{
    uint32_t ScaledHeight = Height;
    if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        CCS_UNIT ScaleFactor;
        GetCCSScaleFactor(pTexInfo, ScaleFactor);

        ScaledHeight /= ScaleFactor.Downscale.Height;
    }

    return ScaledHeight;
}